

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

void output_velocities(FILE *fdf,char *s,float (*full_velocities) [512] [2],int pic_x,int pic_y,
                      int n)

{
  char *pcVar1;
  size_t sVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  void *__ptr;
  long lVar7;
  float *pfVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  float y;
  FILE *local_58;
  float (*local_50) [512] [2];
  char *local_48;
  size_t local_40;
  float x;
  
  local_50 = full_velocities;
  local_48 = s;
  if (fdf == (FILE *)0x0) {
    puts("\nFatal error: full velocity file not opened");
    exit(1);
  }
  y = (float)pic_x;
  x = (float)pic_y;
  fwrite(&x,4,1,(FILE *)fdf);
  fwrite(&y,4,1,(FILE *)fdf);
  y = (float)(pic_x + n * -2);
  iVar11 = pic_y + n * -2;
  x = (float)iVar11;
  fwrite(&x,4,1,(FILE *)fdf);
  fwrite(&y,4,1,(FILE *)fdf);
  y = (float)n;
  x = y;
  fwrite(&x,4,1,(FILE *)fdf);
  local_58 = (FILE *)fdf;
  fwrite(&y,4,1,(FILE *)fdf);
  lVar10 = (long)n;
  pfVar3 = (float *)((long)local_50 + lVar10 * 0x1008 + 4);
  uVar5 = 0;
  uVar9 = 0;
  for (lVar6 = lVar10; lVar7 = lVar10, pfVar8 = pfVar3, lVar6 < pic_x - n; lVar6 = lVar6 + 1) {
    for (; lVar7 < pic_y - n; lVar7 = lVar7 + 1) {
      if (((pfVar8[-1] == 100.0) && (!NAN(pfVar8[-1]))) || ((*pfVar8 == 100.0 && (!NAN(*pfVar8)))))
      {
        uVar5 = uVar5 + 1;
      }
      else {
        uVar9 = uVar9 + 1;
      }
      pfVar8 = pfVar8 + 2;
    }
    pfVar3 = pfVar3 + 0x400;
  }
  local_40 = (size_t)(iVar11 * 2);
  __ptr = (void *)((long)local_50 + lVar10 * 0x1008);
  uVar4 = 0x18;
  for (; lVar10 < pic_x - n; lVar10 = lVar10 + 1) {
    sVar2 = fwrite(__ptr,4,local_40,local_58);
    uVar4 = uVar4 + (int)sVar2;
    __ptr = (void *)((long)__ptr + 0x1000);
  }
  fclose(local_58);
  pcVar1 = local_48;
  printf("\n%s velocities output from output_velocities: %d velocities\n",local_48,(ulong)uVar4);
  printf("Number of positions with velocity: %d\n",(ulong)uVar9);
  printf("Number of positions without velocity: %d\n",(ulong)uVar5);
  printf("Percentage of %s velocities: %f\n",
         ((double)(int)uVar9 / (double)(int)(uVar9 + uVar5)) * 100.0,pcVar1);
  fflush(_stdout);
  return;
}

Assistant:

void output_velocities(FILE *fdf, char s[],
float full_velocities[PIC_X][PIC_Y][2],
int pic_x, int pic_y,
int n)
{
float x,y;
int i,j,bytes,no_novals,no_vals;

//int NORMAL = FALSE;
//if(strcmp(s,"Normal")==0) NORMAL = TRUE;
if(fdf==NULL)
	{
	printf("\nFatal error: full velocity file not opened\n");
	exit(1);
	}
/* original size */
y = (float) pic_x;
x = (float) pic_y;
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);

/* size of result data */
y = (float) (pic_x-2*n);
x = (float) (pic_y-2*n);
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);

/* offset to start of data */
y = (float) n;
x = (float) n;
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);
bytes = 24;

no_novals = no_vals = 0;
/* Prepare velocities for output, i.e. rotate by 90 degrees */
for(i=n;i<pic_x-n;i++)
for(j=n;j<pic_y-n;j++)
	{
	if(full_velocities[i][j][0] != NO_VALUE &&
	   full_velocities[i][j][1] != NO_VALUE)
		{
		no_vals++;
		}
	else
		{
		no_novals++;
		}
	}
for(i=n;i<pic_x-n;i++)
	{
	bytes += fwrite(&full_velocities[i][n][0], 4, (pic_y-2*n)*2, fdf);
	}
fclose(fdf);
printf("\n%s velocities output from output_velocities: %d velocities\n",s,bytes);
printf("Number of positions with velocity: %d\n",no_vals);
printf("Number of positions without velocity: %d\n",no_novals);
printf("Percentage of %s velocities: %f\n",s,
	no_vals/(1.0*(no_vals+no_novals))*100.0);
fflush(stdout);
}